

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O1

void bit_array_clear_range(void *array,size_t bit,size_t count)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  
  if ((count != 0 && array != (void *)0x0) && (uVar3 = *array, bit < uVar3)) {
    uVar4 = count + bit;
    if (uVar4 <= uVar3) {
      uVar3 = uVar4;
    }
    if (bit < uVar4) {
      do {
        bVar2 = (byte)bit & 7;
        pbVar1 = (byte *)((long)array + (bit >> 3) + 8);
        *pbVar1 = *pbVar1 & (-2 << bVar2 | 0xfeU >> 8 - bVar2);
        bit = bit + 1;
      } while (bit < uVar3);
    }
  }
  return;
}

Assistant:

void bit_array_clear_range(void * array, size_t bit, size_t count)
{
    if (array && count)
    {
        size_t * size = (size_t *) array;
        if (bit < *size)
        {
            unsigned char * ptr = (unsigned char *)(size + 1);
            size_t i;
            for (i = bit; i < *size && i < bit + count; ++i)
                ptr[i >> 3] &= ~(1U << (i & 7));
        }
    }
}